

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pre-process.c
# Opt level: O0

int do_handle_define(dmr_C *C,stream *stream,token **line,token *token,int attr)

{
  token *ptVar1;
  ident *name_00;
  token *token_00;
  int iVar2;
  ident *list2;
  bool bVar3;
  int local_64;
  int clean;
  int ret;
  ident *name;
  symbol *sym;
  token *left;
  token *expansion;
  token *arglist;
  int attr_local;
  token *token_local;
  token **line_local;
  stream *stream_local;
  dmr_C *C_local;
  
  ptVar1 = token->next;
  if ((SUB84(ptVar1->pos,0) & 0x3f) != 2) {
    dmrC_sparse_error(C,token->pos,"expected identifier to \'define\'");
    return 1;
  }
  name_00 = (ptVar1->field_2).ident;
  expansion = (token *)0x0;
  token_00 = ptVar1->next;
  left = token_00;
  if (((ulong)token_00->pos >> 0x15 & 1) == 0) {
    iVar2 = dmrC_match_op(token_00,0x28);
    if (iVar2 == 0) {
      if (token_00 != &dmrC_eof_token_entry_) {
        dmrC_warning(C,token_00->pos,"no whitespace before object-like macro body");
      }
    }
    else {
      left = parse_arguments(C,token_00);
      expansion = token_00;
      if (left == (token *)0x0) {
        return 1;
      }
    }
  }
  list2 = (ident *)parse_expansion(C,left,expansion,name_00);
  if (list2 != (ident *)0x0) {
    local_64 = 1;
    name = (ident *)dmrC_lookup_symbol(name_00,NS_UNDEF|NS_MACRO);
    if ((symbol *)name != (symbol *)0x0) {
      if (attr < (int)(*(uint *)name >> 0x12 & 3)) {
        return 1;
      }
      bVar3 = false;
      if (attr == (*(uint *)name >> 0x12 & 3)) {
        bVar3 = (*(uint *)name >> 8 & 0x1ff) == 1;
      }
      iVar2 = token_list_different(C,(((symbol *)name)->field_14).field_0.expansion,(token *)list2);
      if ((iVar2 == 0) &&
         (iVar2 = token_list_different(C,(((symbol *)name)->field_14).field_0.arglist,expansion),
         iVar2 == 0)) {
        if (bVar3) {
          return 1;
        }
      }
      else {
        local_64 = 0;
        if (((bVar3) && (attr == 1)) ||
           ((((symbol *)name)->field_14).field_0.used_in == C->file_scope)) {
          dmrC_warning(C,ptVar1->pos,"preprocessor token %.*s redefined",(ulong)name_00->len,
                       &name_00->field_0x12);
          dmrC_info(C,((symbol *)name)->pos,"this was the original definition");
        }
      }
    }
    if (((symbol *)name == (symbol *)0x0) || (((symbol *)name)->scope != C->file_scope)) {
      name = (ident *)dmrC_alloc_symbol(C->S,ptVar1->pos,3);
      dmrC_bind_symbol(C->S,(symbol *)name,name_00,NS_MACRO);
      dmrC_add_ident(C,&C->macros,name_00);
      local_64 = 0;
    }
    if (local_64 == 0) {
      name[3].next = list2;
      name[3].symbols = (symbol *)expansion;
      dmrC_allocator_free(&C->token_allocator,token);
    }
    *(uint *)&name->next = *(uint *)&name->next & 0xfffe00ff | 0x100;
    *(undefined8 *)&name[3].len = 0;
    *(uint *)&name->next = *(uint *)&name->next & 0xfff3ffff | (attr & 3U) << 0x12;
    return local_64;
  }
  return 1;
}

Assistant:

static int do_handle_define(struct dmr_C *C, struct stream *stream, struct token **line, struct token *token, int attr)
{
	struct token *arglist, *expansion;
	struct token *left = token->next;
	struct symbol *sym;
	struct ident *name;
	int ret;

        (void) stream;
        (void) line;
        
	if (dmrC_token_type(left) != TOKEN_IDENT) {
		dmrC_sparse_error(C, token->pos, "expected identifier to 'define'");
		return 1;
	}

	name = left->ident;

	arglist = NULL;
	expansion = left->next;
	if (!expansion->pos.whitespace) {
		if (dmrC_match_op(expansion, '(')) {
			arglist = expansion;
			expansion = parse_arguments(C, expansion);
			if (!expansion)
				return 1;
		} else if (!dmrC_eof_token(expansion)) {
			dmrC_warning(C, expansion->pos,
				"no whitespace before object-like macro body");
		}
	}

	expansion = parse_expansion(C, expansion, arglist, name);
	if (!expansion)
		return 1;

	ret = 1;
	sym = dmrC_lookup_symbol(name, (enum namespace_type) (NS_MACRO | NS_UNDEF));
	if (sym) {
		int clean;

		if (attr < sym->attr)
			goto out;

		clean = (attr == sym->attr && sym->ns == NS_MACRO);

		if (token_list_different(C, sym->expansion, expansion) ||
		    token_list_different(C, sym->arglist, arglist)) {
			ret = 0;
			if ((clean && attr == SYM_ATTR_NORMAL)
					|| sym->used_in == C->file_scope) {
				dmrC_warning(C, left->pos, "preprocessor token %.*s redefined",
						name->len, name->name);
				dmrC_info(C, sym->pos, "this was the original definition");
			}
		} else if (clean)
			goto out;
	}

	if (!sym || sym->scope != C->file_scope) {
		sym = dmrC_alloc_symbol(C->S, left->pos, SYM_NODE);
		dmrC_bind_symbol(C->S, sym, name, NS_MACRO);
		dmrC_add_ident(C, &C->macros, name);
		ret = 0;
	}

	if (!ret) {
		sym->expansion = expansion;
		sym->arglist = arglist;
		dmrC_allocator_free(&C->token_allocator, token);	/* Free the "define" token, but not the rest of the line */
	}

	sym->ns = NS_MACRO;
	sym->used_in = NULL;
	sym->attr = attr;
out:
	return ret;
}